

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::DepthCompareCase::render(DepthCompareCase *this,Context *context)

{
  UniformSlot *pUVar1;
  deUint32 programID;
  Vector<float,_3> local_26c;
  Vector<float,_3> local_260;
  Vector<float,_3> local_254;
  Vector<float,_3> local_248;
  Vector<float,_3> local_23c;
  Vector<float,_3> local_230;
  Vector<float,_3> local_224;
  Vector<float,_3> local_218;
  Vector<float,_3> local_20c;
  Vector<float,_3> local_200;
  Vector<float,_3> local_1f4;
  Vector<float,_3> local_1e8;
  Vector<float,_3> local_1dc;
  Vector<float,_3> local_1d0;
  Vector<float,_3> local_1c4;
  Vector<float,_3> local_1b8;
  undefined1 local_1ac [8];
  Vec4 green;
  Vec4 red;
  undefined1 local_178 [4];
  deUint32 shaderID;
  DepthShader shader;
  Context *context_local;
  DepthCompareCase *this_local;
  
  shader.u_color = (UniformSlot *)context;
  DepthShader::DepthShader((DepthShader *)local_178);
  programID = (**(code **)(*(long *)&(shader.u_color)->name + 0x3a8))
                        (shader.u_color,(DepthShader *)local_178);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_1ac,0.0,1.0,0.0,1.0);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x158))(0x3f800000);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x168))(shader.u_color,0x100);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x198))(shader.u_color,0xb71);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x1c8))(shader.u_color,0x207);
  DepthShader::setColor
            ((DepthShader *)local_178,(Context *)shader.u_color,programID,(Vec4 *)(green.m_data + 2)
            );
  pUVar1 = shader.u_color;
  tcu::Vector<float,_3>::Vector(&local_1b8,-1.0,-1.0,0.2);
  tcu::Vector<float,_3>::Vector(&local_1c4,0.0,0.0,0.2);
  sglr::drawQuad((Context *)pUVar1,programID,&local_1b8,&local_1c4);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x1c8))(shader.u_color,this->m_compareOp);
  DepthShader::setColor
            ((DepthShader *)local_178,(Context *)shader.u_color,programID,(Vec4 *)local_1ac);
  pUVar1 = shader.u_color;
  tcu::Vector<float,_3>::Vector(&local_1d0,-1.0,-1.0,0.2);
  tcu::Vector<float,_3>::Vector(&local_1dc,0.0,0.0,0.2);
  sglr::drawQuad((Context *)pUVar1,programID,&local_1d0,&local_1dc);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x1c8))(shader.u_color,0x207);
  DepthShader::setColor
            ((DepthShader *)local_178,(Context *)shader.u_color,programID,(Vec4 *)(green.m_data + 2)
            );
  pUVar1 = shader.u_color;
  tcu::Vector<float,_3>::Vector(&local_1e8,-1.0,0.0,-0.4);
  tcu::Vector<float,_3>::Vector(&local_1f4,0.0,1.0,-0.4);
  sglr::drawQuad((Context *)pUVar1,programID,&local_1e8,&local_1f4);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x1c8))(shader.u_color,this->m_compareOp);
  DepthShader::setColor
            ((DepthShader *)local_178,(Context *)shader.u_color,programID,(Vec4 *)local_1ac);
  pUVar1 = shader.u_color;
  tcu::Vector<float,_3>::Vector(&local_200,-1.0,0.0,-0.1);
  tcu::Vector<float,_3>::Vector(&local_20c,0.0,1.0,-0.1);
  sglr::drawQuad((Context *)pUVar1,programID,&local_200,&local_20c);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x1c8))(shader.u_color,0x207);
  DepthShader::setColor
            ((DepthShader *)local_178,(Context *)shader.u_color,programID,(Vec4 *)(green.m_data + 2)
            );
  pUVar1 = shader.u_color;
  tcu::Vector<float,_3>::Vector(&local_218,0.0,-1.0,0.5);
  tcu::Vector<float,_3>::Vector(&local_224,1.0,0.0,0.5);
  sglr::drawQuad((Context *)pUVar1,programID,&local_218,&local_224);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x1c8))(shader.u_color,this->m_compareOp);
  DepthShader::setColor
            ((DepthShader *)local_178,(Context *)shader.u_color,programID,(Vec4 *)local_1ac);
  pUVar1 = shader.u_color;
  tcu::Vector<float,_3>::Vector(&local_230,0.0,-1.0,0.3);
  tcu::Vector<float,_3>::Vector(&local_23c,1.0,0.0,0.3);
  sglr::drawQuad((Context *)pUVar1,programID,&local_230,&local_23c);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x1c8))(shader.u_color,0x207);
  DepthShader::setColor
            ((DepthShader *)local_178,(Context *)shader.u_color,programID,(Vec4 *)(green.m_data + 2)
            );
  pUVar1 = shader.u_color;
  tcu::Vector<float,_3>::Vector(&local_248,0.0,0.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_254,1.0,1.0,0.0);
  sglr::drawQuad((Context *)pUVar1,programID,&local_248,&local_254);
  (**(code **)(*(long *)&(shader.u_color)->name + 0x1c8))(shader.u_color,this->m_compareOp);
  DepthShader::setColor
            ((DepthShader *)local_178,(Context *)shader.u_color,programID,(Vec4 *)local_1ac);
  pUVar1 = shader.u_color;
  tcu::Vector<float,_3>::Vector(&local_260,0.0,0.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_26c,1.0,1.0,1.0);
  sglr::drawQuad((Context *)pUVar1,programID,&local_260,&local_26c);
  DepthShader::~DepthShader((DepthShader *)local_178);
  return;
}

Assistant:

void render (sglr::Context& context)
	{
		using tcu::Vec3;

		DepthShader	shader;
		deUint32	shaderID = context.createProgram(&shader);

		tcu::Vec4	red		(1.0f, 0.0f, 0.0f, 1.0);
		tcu::Vec4	green	(0.0f, 1.0f, 0.0f, 1.0f);

		// Clear depth to 1
		context.clearDepthf(1.0f);
		context.clear(GL_DEPTH_BUFFER_BIT);

		// Enable depth test.
		context.enable(GL_DEPTH_TEST);

		// Upper left: two quads with same depth
		context.depthFunc(GL_ALWAYS);
		shader.setColor(context, shaderID, red);
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.2f),	Vec3(0.0f, 0.0f, 0.2f));
		context.depthFunc(m_compareOp);
		shader.setColor(context, shaderID, green);
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.2f),	Vec3(0.0f, 0.0f, 0.2f));

		// Lower left: two quads, d1 < d2
		context.depthFunc(GL_ALWAYS);
		shader.setColor(context, shaderID, red);
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, 0.0f, -0.4f),	Vec3(0.0f, 1.0f, -0.4f));
		context.depthFunc(m_compareOp);
		shader.setColor(context, shaderID, green);
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, 0.0f, -0.1f),	Vec3(0.0f, 1.0f, -0.1f));

		// Upper right: two quads, d1 > d2
		context.depthFunc(GL_ALWAYS);
		shader.setColor(context, shaderID, red);
		sglr::drawQuad(context, shaderID, Vec3(0.0f, -1.0f, 0.5f),	Vec3(1.0f, 0.0f, 0.5f));
		context.depthFunc(m_compareOp);
		shader.setColor(context, shaderID, green);
		sglr::drawQuad(context, shaderID, Vec3(0.0f, -1.0f, 0.3f),	Vec3(1.0f, 0.0f, 0.3f));

		// Lower right: two quads, d1 = 0, d2 = [-1..1]
		context.depthFunc(GL_ALWAYS);
		shader.setColor(context, shaderID, red);
		sglr::drawQuad(context, shaderID, Vec3(0.0f, 0.0f, 0.0f),	Vec3(1.0f, 1.0f, 0.0f));
		context.depthFunc(m_compareOp);
		shader.setColor(context, shaderID, green);
		sglr::drawQuad(context, shaderID, Vec3(0.0f, 0.0f, -1.0f),	Vec3(1.0f, 1.0f, 1.0f));
	}